

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O3

void __thiscall capnp::MembraneHook::~MembraneHook(MembraneHook *this)

{
  PromiseArenaMember *node;
  ClientHook *pCVar1;
  Disposer *pDVar2;
  MembranePolicy *pMVar3;
  
  if (this->revoked == false) {
    removeFromMap(this);
  }
  node = &((this->revocationTask).super_PromiseBase.node.ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->revocationTask).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  pCVar1 = (this->resolved).ptr.ptr;
  if (pCVar1 != (ClientHook *)0x0) {
    (this->resolved).ptr.ptr = (ClientHook *)0x0;
    pDVar2 = (this->resolved).ptr.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&pCVar1->_vptr_ClientHook + (long)pCVar1->_vptr_ClientHook[-2]));
  }
  pMVar3 = (this->policy).ptr;
  if (pMVar3 != (MembranePolicy *)0x0) {
    (this->policy).ptr = (MembranePolicy *)0x0;
    pDVar2 = (this->policy).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&pMVar3->_vptr_MembranePolicy + (long)pMVar3->_vptr_MembranePolicy[-2])
              );
  }
  pCVar1 = (this->inner).ptr;
  if (pCVar1 != (ClientHook *)0x0) {
    (this->inner).ptr = (ClientHook *)0x0;
    pDVar2 = (this->inner).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&pCVar1->_vptr_ClientHook + (long)pCVar1->_vptr_ClientHook[-2]));
  }
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~MembraneHook() noexcept(false) {
    if (!revoked) {
      removeFromMap();
    }
  }